

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

bool __thiscall ImFontAtlas::Build(ImFontAtlas *this)

{
  uint *puVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  undefined2 uVar7;
  ImVec2 IVar4;
  undefined2 uVar6;
  undefined2 uVar9;
  stbtt__point sVar5;
  undefined4 uVar8;
  stbtt_uint8 sVar10;
  byte bVar11;
  byte bVar12;
  undefined4 uVar13;
  undefined1 uVar17;
  ImFontAtlas *pIVar14;
  ImFont *pIVar15;
  stbtt_uint8 *data;
  undefined6 uVar18;
  undefined4 uVar19;
  undefined8 *puVar16;
  undefined1 auVar20 [16];
  stbrp_node *psVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined1 auVar24 [16];
  ImVector<ImFontConfig> *this_00;
  stbtt_uint32 sVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  uint uVar35;
  bool bVar25;
  stbtt_uint32 sVar26;
  stbtt_uint32 sVar27;
  stbtt_uint32 sVar28;
  stbtt_uint32 sVar29;
  stbtt_uint32 sVar30;
  undefined4 uVar36;
  ImFontBuildSrcData *pIVar37;
  ImFontConfig *pIVar38;
  ImFont **ppIVar39;
  long lVar40;
  ImFontBuildDstData *pIVar41;
  stbrp_rect *psVar42;
  stbtt_packedchar *psVar43;
  int *piVar44;
  stbrp_context *ptr;
  uchar *puVar45;
  stbrp_rect *psVar46;
  stbtt__point *points;
  stbtt__edge *psVar47;
  stbtt__buf *scanline;
  undefined8 *puVar48;
  stbtt__active_edge *psVar49;
  long *plVar50;
  stbtt__active_edge *psVar51;
  ushort uVar52;
  ushort uVar53;
  ulong uVar54;
  stbtt__active_edge *psVar55;
  stbtt__buf *psVar56;
  ImWchar *pIVar57;
  stbtt__active_edge *extraout_RDX;
  stbtt__active_edge *psVar58;
  ushort *puVar59;
  uint *puVar60;
  int iVar61;
  uint uVar62;
  stbtt__edge *psVar63;
  uchar *puVar64;
  ulong uVar65;
  uint uVar74;
  ulong uVar66;
  ulong uVar67;
  byte *pbVar68;
  uchar *puVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  stbtt__active_edge *psVar73;
  ImBitVector *this_01;
  ulong uVar75;
  long lVar76;
  byte *pbVar77;
  long lVar78;
  bool bVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined8 uVar83;
  float fVar90;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar89;
  float fVar91;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar92 [16];
  float fVar93;
  float fVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 in_ZMM2 [64];
  float fVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar103 [64];
  float fVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar110;
  undefined1 auVar111 [16];
  float fVar112;
  undefined1 auVar113 [64];
  float fVar114;
  stbtt__buf sVar115;
  stbtt_uint32 sStack_4dc;
  undefined1 auStack_4d8 [16];
  undefined1 auStack_4c8 [16];
  ImVector<ImFontBuildSrcData> IStack_4b8;
  void *pvStack_4a0;
  undefined1 auStack_498 [16];
  stbrp_node *psStack_480;
  stbtt__edge *psStack_478;
  undefined8 uStack_470;
  undefined1 auStack_468 [16];
  float *pfStack_458;
  int iStack_44c;
  int iStack_448;
  int iStack_444;
  int iStack_440;
  float fStack_43c;
  ImVector<stbrp_rect> IStack_438;
  ImVector<ImFontBuildDstData> IStack_428;
  ImVector<ImFontConfig> *pIStack_410;
  stbrp_rect *psStack_408;
  undefined8 *puStack_400;
  ImVector<stbtt_packedchar> IStack_3f8;
  stbtt__point *psStack_3e0;
  uchar *puStack_3d8;
  ImFontBuildSrcData *pIStack_3d0;
  ulong uStack_3c8;
  ulong uStack_3c0;
  uchar *puStack_3b8;
  int iStack_3ac;
  float fStack_3a8;
  uint uStack_3a4;
  uint uStack_3a0;
  int iStack_39c;
  float fStack_398;
  float fStack_394;
  int iStack_390;
  int iStack_38c;
  uint uStack_388;
  uint uStack_384;
  stbrp_context *psStack_380;
  long lStack_378;
  stbrp_rect *psStack_370;
  ulong uStack_368;
  long lStack_360;
  long lStack_358;
  ulong uStack_350;
  uint uStack_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  undefined1 auStack_338 [16];
  undefined1 auStack_328 [16];
  ImFontConfig *pIStack_310;
  ulong uStack_308;
  uchar *puStack_300;
  long lStack_2f8;
  size_t sStack_2f0;
  size_t sStack_2e8;
  ulong uStack_2e0;
  stbtt_packedchar *psStack_2d8;
  stbtt__edge *psStack_2d0;
  long lStack_2c8;
  int iStack_2c0;
  int iStack_2bc;
  undefined1 auStack_2b8 [16];
  undefined1 auStack_2a8 [16];
  undefined2 uStack_298;
  undefined2 uStack_296;
  undefined2 uStack_294;
  undefined2 uStack_292;
  undefined2 uStack_290;
  undefined2 uStack_28e;
  undefined2 uStack_28c;
  undefined2 uStack_28a;
  undefined8 uStack_288;
  undefined8 uStack_280;
  undefined2 uStack_278;
  undefined2 uStack_276;
  undefined2 uStack_274;
  undefined2 uStack_272;
  undefined2 uStack_270;
  undefined2 uStack_26e;
  undefined2 uStack_26c;
  undefined2 uStack_26a;
  undefined1 auStack_268 [16];
  undefined1 auStack_258 [16];
  undefined1 auStack_248 [16];
  stbtt__buf asStack_238 [32];
  
  if (this->Locked == true) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x817,"bool ImFontAtlas::Build()");
  }
  if (this->FontBuilderIO != (ImFontBuilderIO *)0x0) {
    bVar25 = (*this->FontBuilderIO->FontBuilder_Build)(this);
    return bVar25;
  }
  ImFontAtlasGetBuilderForStbTruetype::io.FontBuilder_Build = ImFontAtlasBuildWithStbTruetype;
  if ((this->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x867,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildInit(this);
  this->TexID = (ImTextureID)0x0;
  this->TexWidth = 0;
  this->TexHeight = 0;
  (this->TexUvScale).x = 0.0;
  (this->TexUvScale).y = 0.0;
  (this->TexUvWhitePixel).x = 0.0;
  (this->TexUvWhitePixel).y = 0.0;
  ClearTexData(this);
  IStack_4b8.Size = 0;
  IStack_4b8.Capacity = 0;
  IStack_4b8.Data = (ImFontBuildSrcData *)0x0;
  IStack_428.Size = 0;
  IStack_428.Capacity = 0;
  IStack_428.Data = (ImFontBuildDstData *)0x0;
  ImVector<ImFontBuildSrcData>::resize(&IStack_4b8,(this->ConfigData).Size);
  ImVector<ImFontBuildDstData>::resize(&IStack_428,(this->Fonts).Size);
  pIStack_410 = &this->ConfigData;
  memset(IStack_4b8.Data,0,(long)IStack_4b8.Size * 0x110);
  memset(IStack_428.Data,0,(long)IStack_428.Size << 5);
  iVar32 = 0;
  while (this_00 = pIStack_410, iStack_3ac = pIStack_410->Size, iStack_44c = iVar32,
        iVar32 < iStack_3ac) {
    pIVar37 = ImVector<ImFontBuildSrcData>::operator[](&IStack_4b8,iVar32);
    pIVar38 = ImVector<ImFontConfig>::operator[](this_00,iVar32);
    if ((pIVar38->DstFont == (ImFont *)0x0) ||
       (pIVar14 = pIVar38->DstFont->ContainerAtlas, pIVar14 != this && pIVar14 != (ImFontAtlas *)0x0
       )) {
      __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                    ,0x87f,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    pIVar37->DstIndex = -1;
    iVar61 = 0;
    iVar32 = -1;
    while ((iVar61 < (this->Fonts).Size && (iVar32 == -1))) {
      pIVar15 = pIVar38->DstFont;
      ppIVar39 = ImVector<ImFont_*>::operator[](&this->Fonts,iVar61);
      if (pIVar15 == *ppIVar39) {
        pIVar37->DstIndex = iVar61;
        iVar32 = iVar61;
      }
      else {
        iVar32 = pIVar37->DstIndex;
      }
      iVar61 = iVar61 + 1;
    }
    if (iVar32 == -1) {
      __assert_fail("src_tmp.DstIndex != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                    ,0x888,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    data = (stbtt_uint8 *)pIVar38->FontData;
    iVar32 = pIVar38->FontNo;
    sVar10 = *data;
    auStack_498._0_8_ = pIVar38;
    if (sVar10 == '\0') {
      if (data[1] != '\x01') goto LAB_0017c3c7;
LAB_0017be97:
      if ((data[2] != '\0') || (data[3] != '\0')) goto LAB_0017c3c7;
LAB_0017beaf:
      sVar31 = -(uint)(iVar32 != 0);
    }
    else {
      if (sVar10 != 't') {
        if (sVar10 != 'O') {
          if ((sVar10 != '1') || (data[1] != '\0')) goto LAB_0017c3c7;
          goto LAB_0017be97;
        }
        if (((data[1] != 'T') || (data[2] != 'T')) || (data[3] != 'O')) goto LAB_0017c3c7;
        goto LAB_0017beaf;
      }
      sVar10 = data[1];
      if (sVar10 == 'r') {
        if ((data[2] != 'u') || (data[3] != 'e')) goto LAB_0017c3c7;
        goto LAB_0017beaf;
      }
      if (sVar10 != 't') {
        if (((sVar10 != 'y') || (data[2] != 'p')) || (data[3] != '1')) goto LAB_0017c3c7;
        goto LAB_0017beaf;
      }
      if (((data[2] != 'c') || (data[3] != 'f')) ||
         (((sVar31 = ttULONG(data + 4), sVar31 != 0x20000 && (sVar31 != 0x10000)) ||
          (uVar62 = *(uint *)(data + 8),
          (int)(uVar62 >> 0x18 | (uVar62 & 0xff0000) >> 8 | (uVar62 & 0xff00) << 8 | uVar62 << 0x18)
          <= iVar32)))) goto LAB_0017c3c7;
      sVar31 = ttULONG(data + (long)iVar32 * 4 + 0xc);
    }
    if ((int)sVar31 < 0) {
LAB_0017c3c7:
      __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                    ,0x88d,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    (pIVar37->FontInfo).data = data;
    (pIVar37->FontInfo).fontstart = sVar31;
    (pIVar37->FontInfo).cff.data = (uchar *)0x0;
    (pIVar37->FontInfo).cff.cursor = 0;
    (pIVar37->FontInfo).cff.size = 0;
    sVar26 = stbtt__find_table(data,sVar31,"cmap");
    sVar27 = stbtt__find_table(data,sVar31,"loca");
    auStack_468._0_4_ = sVar27;
    (pIVar37->FontInfo).loca = sVar27;
    sVar27 = stbtt__find_table(data,sVar31,"head");
    auStack_4d8._0_4_ = sVar27;
    (pIVar37->FontInfo).head = sVar27;
    sVar27 = stbtt__find_table(data,sVar31,"glyf");
    (pIVar37->FontInfo).glyf = sVar27;
    sVar28 = stbtt__find_table(data,sVar31,"hhea");
    (pIVar37->FontInfo).hhea = sVar28;
    sVar29 = stbtt__find_table(data,sVar31,"hmtx");
    (pIVar37->FontInfo).hmtx = sVar29;
    sVar30 = stbtt__find_table(data,sVar31,"kern");
    (pIVar37->FontInfo).kern = sVar30;
    sVar30 = stbtt__find_table(data,sVar31,"GPOS");
    auVar95 = in_ZMM3._0_16_;
    auVar111 = in_ZMM2._0_16_;
    (pIVar37->FontInfo).gpos = sVar30;
    if ((((sVar26 == 0) || (auStack_4d8._0_4_ == 0)) || (sVar28 == 0)) || (sVar29 == 0))
    goto LAB_0017e6dc;
    if (sVar27 == 0) {
      auStack_4c8._0_8_ = auStack_4c8._0_8_ & 0xffffffff00000000;
      uStack_470._0_4_ = 0;
      IStack_3f8.Size = 2;
      sStack_4dc = 0;
      sVar27 = stbtt__find_table(data,sVar31,"CFF ");
      if (sVar27 == 0) goto LAB_0017e6dc;
      (pIVar37->FontInfo).fontdicts.data = (uchar *)0x0;
      (pIVar37->FontInfo).fontdicts.cursor = 0;
      (pIVar37->FontInfo).fontdicts.size = 0;
      (pIVar37->FontInfo).fdselect.data = (uchar *)0x0;
      (pIVar37->FontInfo).fdselect.cursor = 0;
      (pIVar37->FontInfo).fdselect.size = 0;
      (pIVar37->FontInfo).cff.data = data + sVar27;
      (pIVar37->FontInfo).cff.cursor = 0;
      (pIVar37->FontInfo).cff.size = 0x20000000;
      puVar45 = (pIVar37->FontInfo).cff.data;
      uVar22 = (pIVar37->FontInfo).cff.cursor;
      uVar23 = (pIVar37->FontInfo).cff.size;
      asStack_238[0].data._0_4_ = (int)puVar45;
      asStack_238[0].data._4_4_ = (undefined4)((ulong)puVar45 >> 0x20);
      in_ZMM2 = ZEXT1664(auVar111);
      in_ZMM3 = ZEXT1664(auVar95);
      asStack_238[0].cursor = uVar22;
      asStack_238[0].size = uVar23;
      stbtt__buf_skip(asStack_238,2);
      lVar40 = (long)asStack_238[0].cursor;
      uVar62 = 0;
      if (asStack_238[0].cursor < asStack_238[0].size) {
        asStack_238[0].cursor = asStack_238[0].cursor + 1;
        uVar62 = (uint)*(byte *)(CONCAT44(asStack_238[0].data._4_4_,(int)asStack_238[0].data) +
                                lVar40);
      }
      stbtt__buf_seek(asStack_238,uVar62);
      stbtt__cff_get_index(asStack_238);
      sVar115 = stbtt__cff_get_index(asStack_238);
      IStack_438 = (ImVector<stbrp_rect>)stbtt__cff_index_get(sVar115,0);
      stbtt__cff_get_index(asStack_238);
      sVar115 = stbtt__cff_get_index(asStack_238);
      (pIVar37->FontInfo).gsubrs = sVar115;
      stbtt__dict_get_ints((stbtt__buf *)&IStack_438,0x11,1,(stbtt_uint32 *)auStack_4c8);
      stbtt__dict_get_ints((stbtt__buf *)&IStack_438,0x106,1,(stbtt_uint32 *)&IStack_3f8);
      stbtt__dict_get_ints((stbtt__buf *)&IStack_438,0x124,1,(stbtt_uint32 *)&uStack_470);
      stbtt__dict_get_ints((stbtt__buf *)&IStack_438,0x125,1,&sStack_4dc);
      sVar115.data._4_4_ = asStack_238[0].data._4_4_;
      sVar115.data._0_4_ = (int)asStack_238[0].data;
      sVar115.cursor = asStack_238[0].cursor;
      sVar115.size = asStack_238[0].size;
      sVar115 = stbtt__get_subrs(sVar115,(stbtt__buf)IStack_438);
      sVar27 = sStack_4dc;
      (pIVar37->FontInfo).subrs = sVar115;
      if ((IStack_3f8.Size != 2) || (uVar36 = auStack_4c8._0_4_, auStack_4c8._0_4_ == 0))
      goto LAB_0017e6dc;
      if ((stbtt_uint32)uStack_470 != 0) {
        if (sStack_4dc == 0) goto LAB_0017e6dc;
        stbtt__buf_seek(asStack_238,(stbtt_uint32)uStack_470);
        sVar115 = stbtt__cff_get_index(asStack_238);
        (pIVar37->FontInfo).fontdicts = sVar115;
        sVar115 = stbtt__buf_range(asStack_238,sVar27,asStack_238[0].size - sVar27);
        (pIVar37->FontInfo).fdselect = sVar115;
      }
      stbtt__buf_seek(asStack_238,uVar36);
      sVar115 = stbtt__cff_get_index(asStack_238);
      (pIVar37->FontInfo).charstrings = sVar115;
    }
    else if (auStack_468._0_4_ == 0) goto LAB_0017e6dc;
    sVar31 = stbtt__find_table(data,sVar31,"maxp");
    if (sVar31 == 0) {
      uVar62 = 0xffff;
    }
    else {
      uVar62 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar31 + 4) << 8 |
                             *(ushort *)(data + (ulong)sVar31 + 4) >> 8);
    }
    (pIVar37->FontInfo).numGlyphs = uVar62;
    uVar52 = *(ushort *)(data + (ulong)sVar26 + 2);
    (pIVar37->FontInfo).index_map = 0;
    uVar75 = (ulong)(ushort)(uVar52 << 8 | uVar52 >> 8);
    uVar62 = sVar26 + 4;
    iVar32 = 0;
    while (bVar25 = uVar75 != 0, uVar75 = uVar75 - 1, bVar25) {
      uVar52 = *(ushort *)(data + uVar62) << 8 | *(ushort *)(data + uVar62) >> 8;
      if ((uVar52 == 0) ||
         ((uVar52 == 3 &&
          ((uVar52 = *(ushort *)(data + (ulong)uVar62 + 2) << 8 |
                     *(ushort *)(data + (ulong)uVar62 + 2) >> 8, uVar52 == 10 || (uVar52 == 1))))))
      {
        sVar31 = ttULONG(data + (ulong)uVar62 + 4);
        iVar32 = sVar31 + sVar26;
        (pIVar37->FontInfo).index_map = iVar32;
      }
      uVar62 = uVar62 + 8;
    }
    if (iVar32 == 0) goto LAB_0017e6dc;
    (pIVar37->FontInfo).indexToLocFormat =
         (uint)(ushort)(*(ushort *)(data + (long)(pIVar37->FontInfo).head + 0x32) << 8 |
                       *(ushort *)(data + (long)(pIVar37->FontInfo).head + 0x32) >> 8);
    pIVar41 = ImVector<ImFontBuildDstData>::operator[](&IStack_428,pIVar37->DstIndex);
    pIVar57 = *(ImWchar **)(auStack_498._0_8_ + 0x38);
    if (pIVar57 == (ImWchar *)0x0) {
      pIVar57 = GetGlyphRangesDefault::ranges;
    }
    pIVar37->SrcRanges = pIVar57;
    uVar62 = pIVar37->GlyphsHighest;
    for (; (*pIVar57 != 0 && (uVar52 = pIVar57[1], uVar52 != 0)); pIVar57 = pIVar57 + 2) {
      if ((int)uVar62 <= (int)(uint)uVar52) {
        uVar62 = (uint)uVar52;
      }
      pIVar37->GlyphsHighest = uVar62;
    }
    pIVar41->SrcCount = pIVar41->SrcCount + 1;
    if ((int)uVar62 < pIVar41->GlyphsHighest) {
      uVar62 = pIVar41->GlyphsHighest;
    }
    pIVar41->GlyphsHighest = uVar62;
    iVar32 = iStack_44c + 1;
  }
  iVar32 = 0;
  for (iVar61 = 0; iVar61 < IStack_4b8.Size; iVar61 = iVar61 + 1) {
    pIVar37 = ImVector<ImFontBuildSrcData>::operator[](&IStack_4b8,iVar61);
    pIVar41 = ImVector<ImFontBuildDstData>::operator[](&IStack_428,pIVar37->DstIndex);
    ImBitVector::Create(&pIVar37->GlyphsSet,pIVar37->GlyphsHighest + 1);
    this_01 = &pIVar41->GlyphsSet;
    if ((pIVar41->GlyphsSet).Storage.Size == 0) {
      ImBitVector::Create(this_01,pIVar41->GlyphsHighest + 1);
    }
    for (puVar59 = pIVar37->SrcRanges;
        (uVar62 = (uint)*puVar59, *puVar59 != 0 && (uVar52 = puVar59[1], uVar52 != 0));
        puVar59 = puVar59 + 2) {
      for (; uVar62 <= uVar52; uVar62 = uVar62 + 1) {
        bVar25 = ImBitVector::TestBit(this_01,uVar62);
        if ((!bVar25) && (iVar33 = stbtt_FindGlyphIndex(&pIVar37->FontInfo,uVar62), iVar33 != 0)) {
          pIVar37->GlyphsCount = pIVar37->GlyphsCount + 1;
          pIVar41->GlyphsCount = pIVar41->GlyphsCount + 1;
          ImBitVector::SetBit(&pIVar37->GlyphsSet,uVar62);
          ImBitVector::SetBit(this_01,uVar62);
          iVar32 = iVar32 + 1;
        }
        uVar52 = puVar59[1];
      }
    }
  }
  iVar61 = 0;
  while (iVar61 < IStack_4b8.Size) {
    auStack_4d8._0_4_ = iVar61;
    pIVar37 = ImVector<ImFontBuildSrcData>::operator[](&IStack_4b8,iVar61);
    ImVector<int>::reserve(&pIVar37->GlyphsList,pIVar37->GlyphsCount);
    auStack_498._0_8_ = &pIVar37->GlyphsSet;
    puVar60 = (pIVar37->GlyphsSet).Storage.Data;
    puVar1 = puVar60 + (pIVar37->GlyphsSet).Storage.Size;
    iVar61 = 0;
    for (; puVar60 < puVar1; puVar60 = puVar60 + 1) {
      uVar62 = *puVar60;
      if (uVar62 != 0) {
        for (uVar74 = 0; uVar74 != 0x20; uVar74 = uVar74 + 1) {
          if ((uVar62 >> (uVar74 & 0x1f) & 1) != 0) {
            asStack_238[0].data._0_4_ = uVar74 + iVar61;
            ImVector<int>::push_back(&pIVar37->GlyphsList,(int *)asStack_238);
          }
        }
      }
      iVar61 = iVar61 + 0x20;
    }
    ImVector<unsigned_int>::clear((ImVector<unsigned_int> *)auStack_498._0_8_);
    iVar61 = auStack_4d8._0_4_ + 1;
    if ((pIVar37->GlyphsList).Size != pIVar37->GlyphsCount) {
      __assert_fail("src_tmp.GlyphsList.Size == src_tmp.GlyphsCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                    ,0x8bc,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
  }
  for (iVar61 = 0; iVar61 < IStack_428.Size; iVar61 = iVar61 + 1) {
    pIVar41 = ImVector<ImFontBuildDstData>::operator[](&IStack_428,iVar61);
    ImVector<unsigned_int>::clear(&(pIVar41->GlyphsSet).Storage);
  }
  ImVector<ImFontBuildDstData>::clear(&IStack_428);
  IStack_438.Size = 0;
  IStack_438.Capacity = 0;
  IStack_438.Data = (stbrp_rect *)0x0;
  IStack_3f8.Size = 0;
  IStack_3f8.Capacity = 0;
  IStack_3f8.Data = (stbtt_packedchar *)0x0;
  ImVector<stbrp_rect>::resize(&IStack_438,iVar32);
  ImVector<stbtt_packedchar>::resize(&IStack_3f8,iVar32);
  uVar75 = 0;
  memset(IStack_438.Data,0,(long)IStack_438.Size << 4);
  memset(IStack_3f8.Data,0,(long)IStack_3f8.Size * 0x1c);
  iVar61 = 0;
  iVar32 = 0;
  auVar111._12_4_ = 0;
  auVar111._0_12_ = auStack_4d8._4_12_;
  auStack_4d8 = auVar111 << 0x20;
  uStack_348 = 0x80000000;
  uStack_344 = 0x80000000;
  uStack_340 = 0x80000000;
  uStack_33c = 0x80000000;
  while( true ) {
    iVar33 = (int)uVar75;
    if (IStack_4b8.Size <= iVar33) break;
    pIVar37 = ImVector<ImFontBuildSrcData>::operator[](&IStack_4b8,iVar33);
    if (pIVar37->GlyphsCount != 0) {
      psVar42 = ImVector<stbrp_rect>::operator[](&IStack_438,iVar32);
      pIVar37->Rects = psVar42;
      psVar43 = ImVector<stbtt_packedchar>::operator[](&IStack_3f8,iVar61);
      pIVar37->PackedChars = psVar43;
      iVar72 = pIVar37->GlyphsCount;
      pIVar38 = ImVector<ImFontConfig>::operator[](pIStack_410,iVar33);
      fVar80 = pIVar38->SizePixels;
      (pIVar37->PackRange).font_size = fVar80;
      (pIVar37->PackRange).first_unicode_codepoint_in_range = 0;
      (pIVar37->PackRange).array_of_unicode_codepoints = (pIVar37->GlyphsList).Data;
      iVar33 = (pIVar37->GlyphsList).Size;
      (pIVar37->PackRange).num_chars = iVar33;
      (pIVar37->PackRange).chardata_for_range = pIVar37->PackedChars;
      (pIVar37->PackRange).h_oversample = (uchar)pIVar38->OversampleH;
      (pIVar37->PackRange).v_oversample = (uchar)pIVar38->OversampleV;
      auStack_498._0_8_ = uVar75;
      if (fVar80 <= 0.0) {
        uVar52 = *(ushort *)((pIVar37->FontInfo).data + (long)(pIVar37->FontInfo).head + 0x12);
        fVar80 = (float)((uint)fVar80 ^ uStack_348) / (float)(ushort)(uVar52 << 8 | uVar52 >> 8);
      }
      else {
        fVar80 = stbtt_ScaleForPixelHeight(&pIVar37->FontInfo,fVar80);
      }
      iVar32 = iVar32 + iVar72;
      auStack_468._0_4_ = iVar61 + iVar72;
      iVar61 = this->TexGlyphPadding;
      lVar40 = 6;
      for (lVar76 = 0; lVar76 < iVar33; lVar76 = lVar76 + 1) {
        piVar44 = ImVector<int>::operator[](&pIVar37->GlyphsList,(int)lVar76);
        iVar33 = stbtt_FindGlyphIndex(&pIVar37->FontInfo,*piVar44);
        if (iVar33 == 0) {
          __assert_fail("glyph_index_in_font != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                        ,0x8eb,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
        }
        in_ZMM2 = ZEXT464((uint)fVar80);
        stbtt_GetGlyphBitmapBoxSubpixel
                  (&pIVar37->FontInfo,iVar33,fVar80 * (float)pIVar38->OversampleH,
                   fVar80 * (float)pIVar38->OversampleV,fVar80,in_ZMM3._0_4_,(int *)asStack_238,
                   (int *)auStack_4c8,(int *)&uStack_470,(int *)&sStack_4dc);
        uVar62 = (pIVar38->OversampleH +
                 (((stbtt_uint32)uStack_470 + iVar61) - (int)asStack_238[0].data)) - 1;
        psVar42 = pIVar37->Rects;
        *(short *)((long)psVar42 + lVar40 + -2) = (short)uVar62;
        uVar74 = (pIVar38->OversampleV + ((sStack_4dc + iVar61) - auStack_4c8._0_4_)) - 1;
        *(short *)((long)&psVar42->id + lVar40) = (short)uVar74;
        auStack_4d8._0_4_ = auStack_4d8._0_4_ + (uVar74 & 0xffff) * (uVar62 & 0xffff);
        iVar33 = (pIVar37->GlyphsList).Size;
        lVar40 = lVar40 + 0x10;
      }
      uVar75 = auStack_498._0_8_;
      iVar61 = auStack_468._0_4_;
    }
    uVar75 = (ulong)((int)uVar75 + 1);
  }
  this->TexHeight = 0;
  fVar80 = (float)this->TexDesiredWidth;
  if ((int)fVar80 < 1) {
    auVar95._0_4_ = (float)(int)auStack_4d8._0_4_;
    auVar95._4_12_ = in_ZMM2._4_12_;
    auVar111 = vsqrtss_avx(auVar95,auVar95);
    iVar32 = (int)auVar111._0_4_;
    fVar80 = 5.73972e-42;
    if ((iVar32 < 0xb33) && (fVar80 = 2.86986e-42, iVar32 < 0x599)) {
      fVar80 = (float)((uint)(0x2cb < iVar32) * 0x200 + 0x200);
    }
  }
  this->TexWidth = (int)fVar80;
  iVar32 = this->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar61 = (int)fVar80 - iVar32;
  psStack_480 = (stbrp_node *)ImGui::MemAlloc((long)iVar61 << 4);
  if ((ptr == (stbrp_context *)0x0) || (psStack_480 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (psStack_480 != (stbrp_node *)0x0) {
      ImGui::MemFree(psStack_480);
    }
    psStack_480 = (stbrp_node *)0x0;
    iVar32 = 0;
    fVar80 = 0.0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if ((iVar32 < -0x7fff) || (0xffff < iVar61)) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_rectpack.h"
                    ,0x10a,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    uVar62 = iVar61 - 1;
    uVar66 = 0;
    psVar21 = psStack_480;
    uVar75 = uVar66;
    if (0 < (int)uVar62) {
      uVar66 = (ulong)uVar62;
      uVar75 = uVar66;
    }
    while( true ) {
      bVar25 = uVar66 == 0;
      uVar66 = uVar66 - 1;
      if (bVar25) break;
      psVar21->next = psVar21 + 1;
      psVar21 = psVar21 + 1;
    }
    psStack_480[uVar75].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = psStack_480;
    ptr->active_head = ptr->extra;
    ptr->width = iVar61;
    ptr->height = 0x8000 - iVar32;
    ptr->num_nodes = iVar61;
    ptr->align = (int)(uVar62 + iVar61) / iVar61;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)iVar61;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  psStack_380 = ptr;
  ImFontAtlasBuildPackCustomRects(this,ptr);
  auStack_4c8._12_4_ = fVar80;
  for (iVar61 = 0; uVar36 = auStack_4c8._12_4_, iVar61 < IStack_4b8.Size; iVar61 = iVar61 + 1) {
    pIVar37 = ImVector<ImFontBuildSrcData>::operator[](&IStack_4b8,iVar61);
    if (pIVar37->GlyphsCount != 0) {
      stbrp_pack_rects(psStack_380,pIVar37->Rects,pIVar37->GlyphsCount);
      psVar42 = pIVar37->Rects;
      uVar75 = (ulong)(uint)pIVar37->GlyphsCount;
      if (pIVar37->GlyphsCount < 1) {
        uVar75 = 0;
      }
      for (lVar40 = 0; uVar75 * 0x10 != lVar40; lVar40 = lVar40 + 0x10) {
        if (*(int *)((long)&psVar42->was_packed + lVar40) != 0) {
          iVar33 = (uint)*(ushort *)((long)&psVar42->h + lVar40) +
                   (uint)*(ushort *)((long)&psVar42->y + lVar40);
          if (iVar33 < this->TexHeight) {
            iVar33 = this->TexHeight;
          }
          this->TexHeight = iVar33;
        }
      }
    }
  }
  uVar62 = this->TexHeight;
  if ((this->Flags & 1) == 0) {
    uVar62 = (int)(uVar62 - 1) >> 1 | uVar62 - 1;
    uVar62 = (int)uVar62 >> 2 | uVar62;
    uVar62 = (int)uVar62 >> 4 | uVar62;
    uVar62 = (int)uVar62 >> 8 | uVar62;
    uVar62 = (int)uVar62 >> 0x10 | uVar62;
  }
  iVar61 = uVar62 + 1;
  this->TexHeight = iVar61;
  auVar111 = vpinsrd_avx(ZEXT416((uint)this->TexWidth),iVar61,1);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar92._8_4_ = 0x3f800000;
  auVar92._0_8_ = 0x3f8000003f800000;
  auVar92._12_4_ = 0x3f800000;
  auVar111 = vdivps_avx(auVar92,auVar111);
  IVar4 = (ImVec2)vmovlps_avx(auVar111);
  this->TexUvScale = IVar4;
  puVar45 = (uchar *)ImGui::MemAlloc((long)(iVar61 * this->TexWidth));
  this->TexPixelsAlpha8 = puVar45;
  memset(puVar45,0,(long)this->TexHeight * (long)this->TexWidth);
  uVar75 = 0;
  puStack_3d8 = this->TexPixelsAlpha8;
  lVar40 = (long)(int)uVar36;
  uStack_278 = (undefined2)iVar32;
  puStack_300 = puStack_3d8 + 1;
  uStack_298 = 1;
  uStack_296 = 1;
  uStack_294 = 1;
  uStack_292 = 1;
  uStack_290 = 1;
  uStack_28e = 1;
  uStack_28c = 1;
  uStack_28a = 1;
  lStack_378 = lVar40;
  uStack_276 = uStack_278;
  uStack_274 = uStack_278;
  uStack_272 = uStack_278;
  uStack_270 = uStack_278;
  uStack_26e = uStack_278;
  uStack_26c = uStack_278;
  uStack_26a = uStack_278;
  while( true ) {
    iVar32 = (int)uVar75;
    if (IStack_4b8.Size <= iVar32) break;
    pIStack_310 = ImVector<ImFontConfig>::operator[](pIStack_410,iVar32);
    uStack_308 = uVar75;
    pIVar37 = ImVector<ImFontBuildSrcData>::operator[](&IStack_4b8,iVar32);
    if (pIVar37->GlyphsCount != 0) {
      psVar42 = pIVar37->Rects;
      bVar25 = true;
      lVar76 = 0;
      pIStack_3d0 = pIVar37;
      psStack_370 = psVar42;
      while (bVar25) {
        fVar80 = (pIVar37->PackRange).font_size;
        if (fVar80 <= 0.0) {
          auVar105._4_4_ = uStack_344;
          auVar105._0_4_ = uStack_348;
          auVar105._8_4_ = uStack_340;
          auVar105._12_4_ = uStack_33c;
          uVar52 = *(ushort *)((pIVar37->FontInfo).data + (long)(pIVar37->FontInfo).head + 0x12);
          fStack_3a8 = (float)((uint)fVar80 ^ uStack_348) /
                       (float)(ushort)(uVar52 << 8 | uVar52 >> 8);
        }
        else {
          fStack_3a8 = stbtt_ScaleForPixelHeight(&pIVar37->FontInfo,fVar80);
          auVar105._4_4_ = uStack_344;
          auVar105._0_4_ = uStack_348;
          auVar105._8_4_ = uStack_340;
          auVar105._12_4_ = uStack_33c;
        }
        uVar75._0_1_ = (pIVar37->PackRange).h_oversample;
        uVar17 = (pIVar37->PackRange).v_oversample;
        uVar18 = *(undefined6 *)&(pIVar37->PackRange).field_0x22;
        uVar75._1_7_ = CONCAT61(uVar18,uVar17);
        auVar108._8_8_ = 0;
        auVar108._0_8_ = uVar75;
        auVar111 = vpmovzxbw_avx(auVar108);
        auVar20._2_2_ = uStack_296;
        auVar20._0_2_ = uStack_298;
        auVar20._4_2_ = uStack_294;
        auVar20._6_2_ = uStack_292;
        auVar20._8_2_ = uStack_290;
        auVar20._10_2_ = uStack_28e;
        auVar20._12_2_ = uStack_28c;
        auVar20._14_2_ = uStack_28a;
        auVar20 = vpsubw_avx(auVar20,auVar111);
        auStack_248 = vpmovzxbd_avx(auVar108);
        auVar111 = vcvtdq2ps_avx(auStack_248);
        auVar99._8_4_ = 0x3f800000;
        auVar99._0_8_ = 0x3f8000003f800000;
        auVar99._12_4_ = 0x3f800000;
        auStack_258 = vdivps_avx(auVar99,auVar111);
        auVar109._8_8_ = 0;
        auVar109._0_8_ = uVar75;
        auVar95 = vpcmpeqb_avx(auVar109,_DAT_001cf0b0);
        auVar92 = vpmovsxbd_avx(auVar95);
        auVar95 = vpmovsxwd_avx(auVar20);
        auVar95 = vcvtdq2ps_avx(auVar95);
        fVar80 = auVar111._0_4_;
        auVar100._0_4_ = fVar80 + fVar80;
        auVar100._4_4_ = auVar111._4_4_ + auVar111._4_4_;
        auVar100._8_4_ = auVar111._8_4_ + auVar111._8_4_;
        auVar100._12_4_ = auVar111._12_4_ + auVar111._12_4_;
        auVar95 = vdivps_avx(auVar95,auVar100);
        auStack_268 = vpandn_avx(auVar92,auVar95);
        lVar76 = (long)(int)lVar76;
        fVar80 = fStack_3a8 * fVar80;
        auVar103 = ZEXT464((uint)fVar80);
        auVar111 = vmovshdup_avx(auVar111);
        fVar82 = fStack_3a8 * auVar111._0_4_;
        auStack_2b8 = ZEXT416((uint)fVar82);
        auStack_2a8 = ZEXT416((uint)fVar80);
        auVar111 = vminss_avx(auStack_2b8,auStack_2a8);
        fStack_43c = 0.35 / auVar111._0_4_;
        fStack_43c = fStack_43c * fStack_43c;
        auVar84._0_4_ = (uint)fVar82 ^ auVar105._0_4_;
        auVar84._4_4_ = auVar105._4_4_;
        auVar84._8_4_ = auVar105._8_4_;
        auVar84._12_4_ = auVar105._12_4_;
        uStack_350 = uVar75 & 0xff;
        uStack_3c0 = (ulong)((uint)uVar75._1_7_ & 0xff);
        uVar62 = (uint)uVar75 & 0xff;
        auVar111 = vunpcklps_avx(ZEXT416((uint)fVar80),auVar84);
        uStack_288 = auVar111._0_8_;
        lVar78 = 0;
        uStack_280 = uStack_288;
LAB_0017cd47:
        fVar80 = auVar103._0_4_;
        if (lVar78 < (pIVar37->PackRange).num_chars) {
          if (((psVar42[lVar76].was_packed != 0) && (psVar46 = psVar42 + lVar76, psVar46->w != 0))
             && (psVar46->h != 0)) {
            piVar44 = (pIVar37->PackRange).array_of_unicode_codepoints;
            if (piVar44 == (int *)0x0) {
              iVar32 = (pIVar37->PackRange).first_unicode_codepoint_in_range + (int)lVar78;
            }
            else {
              iVar32 = piVar44[lVar78];
            }
            psStack_2d8 = (pIVar37->PackRange).chardata_for_range + lVar78;
            psStack_408 = psVar46;
            lStack_360 = lVar78;
            lStack_358 = lVar76;
            iVar61 = stbtt_FindGlyphIndex(&pIVar37->FontInfo,iVar32);
            psVar42 = psStack_408;
            uVar2 = psStack_408->w;
            uVar6 = psStack_408->h;
            uVar7 = psStack_408->x;
            uVar9 = psStack_408->y;
            auVar85._6_2_ = uVar9;
            auVar85._4_2_ = uVar7;
            auVar85._2_2_ = uVar6;
            auVar85._0_2_ = uVar2;
            fVar82 = (float)CONCAT22(uStack_276,uStack_278);
            auVar24._4_2_ = uStack_274;
            auVar24._0_4_ = fVar82;
            auVar24._6_2_ = uStack_272;
            auVar24._8_2_ = uStack_270;
            auVar24._10_2_ = uStack_26e;
            auVar24._12_2_ = uStack_26c;
            auVar24._14_2_ = uStack_26a;
            auVar85._8_8_ = 0;
            auVar95 = vpsubw_avx(auVar85,auVar24);
            auVar111 = vpaddw_avx(auVar85,auVar24);
            auVar111 = vpblendd_avx2(auVar95,auVar111,2);
            uVar83 = auVar111._0_8_;
            psStack_408->w = (short)uVar83;
            psStack_408->h = (short)((ulong)uVar83 >> 0x10);
            psStack_408->x = (short)((ulong)uVar83 >> 0x20);
            psStack_408->y = (short)((ulong)uVar83 >> 0x30);
            puVar45 = (pIVar37->FontInfo).data;
            uVar52 = *(ushort *)(puVar45 + (long)(pIVar37->FontInfo).hhea + 0x22) << 8 |
                     *(ushort *)(puVar45 + (long)(pIVar37->FontInfo).hhea + 0x22) >> 8;
            iVar32 = (pIVar37->FontInfo).hmtx;
            lVar76 = (ulong)uVar52 * 4 + (long)iVar32 + -4;
            lVar78 = (ulong)uVar52 * 4 + (long)iVar32 + -3;
            if (iVar61 < (int)(uint)uVar52) {
              lVar76 = (long)(iVar61 * 4) + (long)iVar32;
              lVar78 = (long)(iVar61 * 4) + 1 + (long)iVar32;
            }
            uStack_3a0 = (uint)puVar45[lVar76];
            uStack_3a4 = (uint)puVar45[lVar78];
            auVar95 = auStack_2b8;
            stbtt_GetGlyphBitmapBoxSubpixel
                      (&pIVar37->FontInfo,iVar61,(float)auStack_2a8._0_4_,auStack_2b8._0_4_,fVar82,
                       fVar80,(int *)&uStack_388,&iStack_38c,&iStack_2bc,&iStack_2c0);
            psVar73 = (stbtt__active_edge *)(ulong)psVar42->x;
            puStack_3b8 = (uchar *)(ulong)psVar42->y;
            uVar74._0_2_ = psVar42->w;
            uVar74._2_2_ = psVar42->h;
            uVar34 = stbtt_GetGlyphShape(&pIVar37->FontInfo,iVar61,(stbtt_vertex **)&uStack_470);
            auVar111 = vpmovzxwd_avx(ZEXT416(uVar74));
            auStack_498 = vpsubd_avx(auVar111,auStack_248);
            auVar111 = vpcmpeqd_avx(auVar95,auVar95);
            auStack_4d8 = vpsubd_avx(auStack_498,auVar111);
            auVar95 = auStack_2b8;
            stbtt_GetGlyphBitmapBoxSubpixel
                      (&pIStack_3d0->FontInfo,iVar61,(float)auStack_2a8._0_4_,auStack_2b8._0_4_,
                       fVar82,fVar80,(int *)&sStack_4dc,(int *)&uStack_384,(int *)0x0,(int *)0x0);
            auVar111 = vpcmpeqd_avx(auStack_4d8,_DAT_001cf0b0);
            auVar95 = vpcmpeqd_avx(auVar95,auVar95);
            auVar111 = vpmovsxdq_avx(auVar111 ^ auVar95);
            if (((auVar95 & ~auVar111) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                -1 < SUB161(auVar95 & ~auVar111,0xf)) {
              puStack_3b8 = puStack_3d8 + (long)((long)puStack_3b8 * lVar40 + (long)&psVar73->next);
              psVar73 = (stbtt__active_edge *)CONCAT44(uStack_470._4_4_,(stbtt_uint32)uStack_470);
              auStack_468._0_4_ = sStack_4dc;
              uStack_368 = (ulong)uStack_384;
              uVar66 = 0;
              uVar75 = (ulong)uVar34;
              if ((int)uVar34 < 1) {
                uVar75 = uVar66;
              }
              uVar54 = 0;
              for (; uVar75 * 0xe - uVar66 != 0; uVar66 = uVar66 + 0xe) {
                uVar54 = (ulong)((int)uVar54 +
                                (uint)(*(char *)((long)&psVar73->fdx + uVar66) == '\x01'));
              }
              if (((int)uVar54 != 0) &&
                 (pvStack_4a0 = ImGui::MemAlloc(uVar54 * 4), pvStack_4a0 != (void *)0x0)) {
                points = (stbtt__point *)0x0;
                iVar32 = 0;
                iVar33 = 0;
                iVar61 = 0;
                do {
                  lVar40 = lStack_378;
                  if (iVar33 == 1) {
                    points = (stbtt__point *)ImGui::MemAlloc((long)iVar61 << 3);
                    if (points == (stbtt__point *)0x0) {
                      ImGui::MemFree((void *)0x0);
                      lVar40 = lStack_378;
                      ImGui::MemFree(pvStack_4a0);
                      break;
                    }
                  }
                  else if (iVar33 == 2) goto LAB_0017d1bd;
                  asStack_238[0].data._0_4_ = 0;
                  auVar103 = ZEXT864(0) << 0x40;
                  uVar74 = 0xffffffff;
                  for (lVar40 = 0; uVar75 * 0xe - lVar40 != 0; lVar40 = lVar40 + 0xe) {
                    uVar34 = (uint)*(byte *)((long)&psVar73->fdx + lVar40);
                    iVar61 = (int)asStack_238[0].data;
                    if (3 < uVar34 - 1) goto LAB_0017d188;
                    auVar111 = vmovshdup_avx(auVar103._0_16_);
                    switch(uVar34) {
                    case 1:
                      if (-1 < (int)uVar74) {
                        *(int *)((long)pvStack_4a0 + (ulong)uVar74 * 4) =
                             (int)asStack_238[0].data - iVar32;
                      }
                      uVar74 = uVar74 + 1;
                      auVar111 = vpmovsxwd_avx(ZEXT416(*(uint *)((long)&psVar73->next + lVar40)));
                      auVar111 = vcvtdq2ps_avx(auVar111);
                      auVar103 = ZEXT1664(auVar111);
                      iVar32 = (int)asStack_238[0].data;
                      iVar61 = (int)asStack_238[0].data + 1;
                      if (points != (stbtt__point *)0x0) {
                        sVar5 = (stbtt__point)vmovlps_avx(auVar111);
                        points[(int)asStack_238[0].data] = sVar5;
                      }
                      break;
                    case 2:
                      auVar111 = vpmovsxwd_avx(ZEXT416(*(uint *)((long)&psVar73->next + lVar40)));
                      auVar111 = vcvtdq2ps_avx(auVar111);
                      auVar103 = ZEXT1664(auVar111);
                      iVar61 = (int)asStack_238[0].data + 1;
                      if (points != (stbtt__point *)0x0) {
                        sVar5 = (stbtt__point)vmovlps_avx(auVar111);
                        points[(int)asStack_238[0].data] = sVar5;
                      }
                      break;
                    case 3:
                      stbtt__tesselate_curve
                                (points,(int *)asStack_238,auVar103._0_4_,auVar111._0_4_,
                                 (float)(int)*(short *)((long)&psVar73->next + lVar40 + 4),
                                 (float)(int)*(short *)((long)&psVar73->next + lVar40 + 6),
                                 (float)(int)*(short *)((long)&psVar73->next + lVar40),
                                 (float)(int)*(short *)((long)&psVar73->next + lVar40 + 2),
                                 fStack_43c,0);
                      goto LAB_0017d149;
                    case 4:
                      stbtt__tesselate_cubic
                                (points,(int *)asStack_238,auVar103._0_4_,auVar111._0_4_,
                                 (float)(int)*(short *)((long)&psVar73->next + lVar40 + 4),
                                 (float)(int)*(short *)((long)&psVar73->next + lVar40 + 6),
                                 (float)(int)*(short *)((long)&psVar73->fx + lVar40),
                                 (float)(int)*(short *)((long)&psVar73->fx + lVar40 + 2),
                                 (float)(int)*(short *)((long)&psVar73->next + lVar40),
                                 (float)(int)*(short *)((long)&psVar73->next + lVar40 + 2),
                                 fStack_43c,0);
LAB_0017d149:
                      auVar111 = vpmovsxwd_avx(ZEXT416(*(uint *)((long)&psVar73->next + lVar40)));
                      auVar111 = vcvtdq2ps_avx(auVar111);
                      auVar103 = ZEXT1664(auVar111);
                      iVar61 = (int)asStack_238[0].data;
                    }
LAB_0017d188:
                    asStack_238[0].data._0_4_ = iVar61;
                  }
                  *(int *)((long)pvStack_4a0 + (long)(int)uVar74 * 4) =
                       (int)asStack_238[0].data - iVar32;
                  iVar33 = iVar33 + 1;
                  iVar61 = (int)asStack_238[0].data;
                } while( true );
              }
            }
            goto LAB_0017dded;
          }
          goto LAB_0017e388;
        }
        bVar25 = false;
      }
      fVar80 = pIStack_310->RasterizerMultiply;
      if ((fVar80 != 1.0) || (NAN(fVar80))) {
        ImFontAtlasBuildMultiplyCalcLookupTable((uchar *)asStack_238,fVar80);
        piVar44 = &pIVar37->Rects->was_packed;
        for (iVar32 = 0; iVar32 < pIVar37->GlyphsCount; iVar32 = iVar32 + 1) {
          if (*piVar44 != 0) {
            ImFontAtlasBuildMultiplyRectAlpha8
                      ((uchar *)asStack_238,this->TexPixelsAlpha8,(uint)*(ushort *)(piVar44 + -1),
                       (uint)*(stbrp_coord *)((long)piVar44 + -2),(uint)*(ushort *)(piVar44 + -2),
                       (uint)*(stbrp_coord *)((long)piVar44 + -6),this->TexWidth);
          }
          piVar44 = piVar44 + 4;
        }
      }
      pIVar37->Rects = (stbrp_rect *)0x0;
    }
    uVar75 = (ulong)((int)uStack_308 + 1);
  }
  ImGui::MemFree(psStack_480);
  ImGui::MemFree(psStack_380);
  ImVector<stbrp_rect>::clear(&IStack_438);
  uVar75 = 0;
  while( true ) {
    if (IStack_4b8.Size <= (int)uVar75) break;
    auStack_4d8._0_8_ = uVar75;
    pIVar37 = ImVector<ImFontBuildSrcData>::operator[](&IStack_4b8,(int)uVar75);
    if (pIVar37->GlyphsCount != 0) {
      pIVar38 = ImVector<ImFontConfig>::operator[](pIStack_410,auStack_4d8._0_4_);
      pIVar15 = pIVar38->DstFont;
      fVar80 = stbtt_ScaleForPixelHeight(&pIVar37->FontInfo,pIVar38->SizePixels);
      puVar45 = (pIVar37->FontInfo).data;
      lVar40 = (long)(pIVar37->FontInfo).hhea;
      uVar52 = *(ushort *)(puVar45 + lVar40 + 4);
      uVar52 = uVar52 << 8 | uVar52 >> 8;
      fVar82 = -1.0;
      if (0 < (short)uVar52) {
        fVar82 = 1.0;
      }
      uVar53 = *(ushort *)(puVar45 + lVar40 + 6);
      uVar53 = uVar53 << 8 | uVar53 >> 8;
      fVar112 = -1.0;
      if (0 < (short)uVar53) {
        fVar112 = 1.0;
      }
      auVar111 = vcvtdq2ps_avx(ZEXT416((uint)(int)((float)(int)(short)uVar52 * fVar80 + fVar82)));
      auVar95 = vcvtdq2ps_avx(ZEXT416((uint)(int)((float)(int)(short)uVar53 * fVar80 + fVar112)));
      ImFontAtlasBuildSetupFont(this,pIVar15,pIVar38,auVar111._0_4_,auVar95._0_4_);
      fVar80 = (pIVar38->GlyphOffset).x;
      auVar111 = vcvtdq2ps_avx(ZEXT416((uint)(int)(pIVar15->Ascent + 0.5)));
      fVar82 = auVar111._0_4_ + (pIVar38->GlyphOffset).y;
      lVar40 = 0;
      for (lVar76 = 0; lVar76 < pIVar37->GlyphsCount; lVar76 = lVar76 + 1) {
        pIVar57 = (ImWchar *)ImVector<int>::operator[](&pIVar37->GlyphsList,(int)lVar76);
        psVar43 = pIVar37->PackedChars;
        fVar112 = 1.0 / (float)this->TexWidth;
        fVar114 = 1.0 / (float)this->TexHeight;
        ImFont::AddGlyph(pIVar15,pIVar38,*pIVar57,
                         fVar80 + *(float *)((long)&psVar43->xoff + lVar40) + 0.0,
                         fVar82 + *(float *)((long)&psVar43->yoff + lVar40) + 0.0,
                         fVar80 + *(float *)((long)&psVar43->xoff2 + lVar40) + 0.0,
                         fVar82 + *(float *)((long)&psVar43->yoff2 + lVar40) + 0.0,
                         fVar112 * (float)*(ushort *)((long)&psVar43->x0 + lVar40),
                         fVar114 * (float)*(ushort *)((long)&psVar43->y0 + lVar40),
                         fVar112 * (float)*(ushort *)((long)&psVar43->x1 + lVar40),
                         fVar114 * (float)*(ushort *)((long)&psVar43->y1 + lVar40),
                         *(float *)((long)&psVar43->xadvance + lVar40));
        lVar40 = lVar40 + 0x1c;
      }
    }
    uVar75 = (ulong)(auStack_4d8._0_4_ + 1);
  }
  for (iVar32 = 0; iVar32 < IStack_4b8.Size; iVar32 = iVar32 + 1) {
    pIVar37 = ImVector<ImFontBuildSrcData>::operator[](&IStack_4b8,iVar32);
    ImFontBuildSrcData::~ImFontBuildSrcData(pIVar37);
  }
  ImFontAtlasBuildFinish(this);
  ImVector<stbtt_packedchar>::~ImVector(&IStack_3f8);
  ImVector<stbrp_rect>::~ImVector(&IStack_438);
LAB_0017e6dc:
  bVar25 = iStack_3ac <= iStack_44c;
  ImVector<ImFontBuildDstData>::~ImVector(&IStack_428);
  ImVector<ImFontBuildSrcData>::~ImVector(&IStack_4b8);
  return bVar25;
LAB_0017d1bd:
  psStack_3e0 = points;
  if (points != (stbtt__point *)0x0) {
    iVar32 = 0;
    for (uVar75 = 0; uVar54 != uVar75; uVar75 = uVar75 + 1) {
      iVar32 = iVar32 + *(int *)((long)pvStack_4a0 + uVar75 * 4);
    }
    psVar47 = (stbtt__edge *)ImGui::MemAlloc((long)(iVar32 + 1) * 0x14);
    psStack_478 = psVar47;
    if (psVar47 != (stbtt__edge *)0x0) {
      iVar32 = 0;
      iVar61 = 0;
      for (uVar75 = 0; uVar75 != uVar54; uVar75 = uVar75 + 1) {
        iVar33 = *(int *)((long)pvStack_4a0 + uVar75 * 4);
        uVar65 = (ulong)(iVar33 - 1);
        iVar72 = iVar33;
        for (uVar66 = 0; iVar70 = (int)uVar65, (long)uVar66 < (long)iVar72; uVar66 = uVar66 + 1) {
          fVar80 = psStack_3e0[(long)iVar32 + (long)iVar70].y;
          fVar82 = psStack_3e0[(long)iVar32 + uVar66].y;
          if ((fVar80 != fVar82) || (NAN(fVar80) || NAN(fVar82))) {
            iVar71 = (int)uVar66;
            iVar72 = iVar70;
            if (fVar80 <= fVar82) {
              iVar72 = iVar71;
              iVar71 = iVar70;
            }
            lVar76 = (long)iVar61;
            psVar73 = (stbtt__active_edge *)(lVar76 * 0x14);
            psVar47[lVar76].invert = (uint)(fVar82 < fVar80);
            auVar86._8_8_ = 0;
            auVar86._0_4_ = psStack_3e0[(long)iVar32 + (long)iVar72].x;
            auVar86._4_4_ = psStack_3e0[(long)iVar32 + (long)iVar72].y;
            auVar111 = vmovhps_avx(auVar86,psStack_3e0[(long)iVar32 + (long)iVar71]);
            fVar81 = auVar111._0_4_ * (float)uStack_288 + 0.0;
            fVar89 = auVar111._4_4_ * (float)((ulong)uStack_288 >> 0x20) + 0.0;
            fVar90 = auVar111._8_4_ * (float)uStack_280 + 0.0;
            fVar91 = auVar111._12_4_ * (float)((ulong)uStack_280 >> 0x20) + 0.0;
            psVar63 = psVar47 + lVar76;
            psVar63->x0 = fVar81;
            psVar63->y0 = fVar89;
            psVar63->x1 = fVar90;
            psVar63->y1 = fVar91;
            iVar61 = iVar61 + 1;
            iVar72 = *(int *)((long)pvStack_4a0 + uVar75 * 4);
          }
          uVar65 = uVar66 & 0xffffffff;
        }
        iVar32 = iVar33 + iVar32;
      }
      stbtt__sort_edges_quicksort(psVar47,iVar61);
      for (uVar75 = 1; (long)uVar75 < (long)iVar61; uVar75 = uVar75 + 1) {
        uVar3 = psStack_478[uVar75].x0;
        uVar8 = psStack_478[uVar75].y0;
        auVar87._4_4_ = uVar8;
        auVar87._0_4_ = uVar3;
        auVar87._8_8_ = 0;
        auVar111 = vmovshdup_avx(auVar87);
        asStack_238[0].cursor = psStack_478[uVar75].invert;
        uVar13 = psStack_478[uVar75].x1;
        uVar19 = psStack_478[uVar75].y1;
        psVar63 = psVar47;
        for (uVar66 = uVar75; 0 < (long)uVar66; uVar66 = uVar66 - 1) {
          if (psVar63->y0 <= auVar111._0_4_) goto LAB_0017d3c1;
          psVar63[1].invert = psVar63->invert;
          fVar80 = psVar63->y0;
          fVar82 = psVar63->x1;
          fVar112 = psVar63->y1;
          psVar63[1].x0 = psVar63->x0;
          psVar63[1].y0 = fVar80;
          psVar63[1].x1 = fVar82;
          psVar63[1].y1 = fVar112;
          psVar63 = psVar63 + -1;
        }
        uVar66 = 0;
LAB_0017d3c1:
        iVar32 = (int)uVar66;
        if (uVar75 != (uVar66 & 0xffffffff)) {
          uVar83 = vmovlps_avx(auVar87);
          psStack_478[iVar32].x0 = (float)(int)uVar83;
          psStack_478[iVar32].y0 = (float)(int)((ulong)uVar83 >> 0x20);
          psStack_478[iVar32].x1 = (float)uVar13;
          psStack_478[iVar32].y1 = (float)uVar19;
          psStack_478[iVar32].invert = asStack_238[0].cursor;
        }
        psVar47 = psVar47 + 1;
        asStack_238[0].data._0_4_ = uVar13;
        asStack_238[0].data._4_4_ = uVar19;
      }
      auStack_4c8._0_8_ = (stbtt__active_edge *)0x0;
      uVar36 = auStack_4d8._0_4_;
      scanline = asStack_238;
      iStack_448 = auStack_498._0_4_;
      if (0x3f < (int)auStack_498._0_4_) {
        scanline = (stbtt__buf *)
                   ImGui::MemAlloc(CONCAT44((int)((ulong)psVar73 >> 0x20),auStack_4d8._0_4_) * 8 + 4
                                  );
      }
      uVar74 = vextractps_avx(auStack_4d8,1);
      psStack_478[iVar61].y0 = (float)(int)((int)uStack_368 + uVar74) + 1.0;
      fStack_398 = (float)(int)auStack_468._0_4_;
      lStack_2c8 = (long)(int)uVar36;
      pfStack_458 = (float *)((long)&scanline->data + lStack_2c8 * 4);
      sStack_2e8 = lStack_2c8 * 4;
      sStack_2f0 = (long)iStack_448 * 4 + 8;
      auStack_338 = vcvtdq2ps_avx(auStack_4d8);
      iStack_390 = 0;
      if (0 < (int)uVar36) {
        iStack_390 = uVar36;
      }
      lStack_2f8 = 0;
      if (0 < lStack_2c8) {
        lStack_2f8 = lStack_2c8;
      }
      uStack_3c8 = 0;
      uStack_2e0 = (ulong)uVar74;
      if ((int)uVar74 < 1) {
        uStack_2e0 = 0;
      }
      psVar73 = (stbtt__active_edge *)0x0;
      iStack_440 = 0;
      puStack_400 = (undefined8 *)0x0;
      uVar75 = uStack_368 & 0xffffffff;
      iVar32 = 0;
      psVar47 = psStack_478;
      while (puVar48 = puStack_400, iVar32 != (int)uStack_2e0) {
        iStack_39c = (int)uVar75;
        fVar82 = (float)iStack_39c;
        fVar80 = fVar82 + 1.0;
        iStack_444 = iVar32;
        memset(scanline,0,sStack_2e8);
        memset(pfStack_458,0,sStack_2f0);
        psVar49 = (stbtt__active_edge *)auStack_4c8;
        psVar58 = extraout_RDX;
        while (psVar55 = psVar49, psVar51 = psVar55->next, psVar51 != (stbtt__active_edge *)0x0) {
          psVar49 = psVar51;
          if (psVar51->ey <= fVar82) {
            psVar58 = psVar51->next;
            psVar55->next = psVar58;
            if ((psVar51->direction == 0.0) && (!NAN(psVar51->direction))) {
              __assert_fail("z->direction",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                            ,0xc63,
                            "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                           );
            }
            psVar51->direction = 0.0;
            psVar51->next = psVar73;
            psVar49 = psVar55;
            psVar73 = psVar51;
          }
        }
        bVar25 = (int)uStack_368 != 0;
        bVar79 = iStack_444 == 0;
        for (; fVar112 = psVar47->y0, fVar112 <= fVar80; psVar47 = psVar47 + 1) {
          fVar114 = psVar47->y1;
          if ((fVar112 != fVar114) || (psVar49 = psVar73, NAN(fVar112) || NAN(fVar114))) {
            if (psVar73 == (stbtt__active_edge *)0x0) {
              if (iStack_440 == 0) {
                puVar48 = (undefined8 *)ImGui::MemAlloc(0x6408);
                if (puVar48 == (undefined8 *)0x0) {
                  __assert_fail("z != __null",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                                ,0xad1,
                                "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                               );
                }
                *puVar48 = puStack_400;
                fVar112 = psVar47->y0;
                fVar114 = psVar47->y1;
                psVar58 = (stbtt__active_edge *)0x31f;
              }
              else {
                psVar58 = (stbtt__active_edge *)(ulong)(iStack_440 - 1);
                puVar48 = puStack_400;
              }
              iStack_440 = (int)psVar58;
              puStack_400 = puVar48;
              psVar73 = (stbtt__active_edge *)(puVar48 + (long)(int)psVar58 * 4 + 1);
              psVar49 = (stbtt__active_edge *)0x0;
            }
            else {
              psVar49 = psVar73->next;
            }
            fVar110 = psVar47->x0;
            auVar101._0_4_ = (psVar47->x1 - fVar110) / (fVar114 - fVar112);
            auVar101._4_12_ = SUB6012((undefined1  [60])0x0,0);
            psVar73->fdx = auVar101._0_4_;
            auVar95 = vcmpss_avx(auVar101,ZEXT416(0),4);
            auVar106._0_4_ = 1.0 / auVar101._0_4_;
            auVar106._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar111 = vblendps_avx(auVar106,_DAT_001da950,0xe);
            psVar73->fx = (auVar101._0_4_ * (fVar82 - fVar112) + fVar110) - fStack_398;
            psVar58 = (stbtt__active_edge *)
                      CONCAT71((int7)((ulong)psVar58 >> 8),psVar47->invert == 0);
            auVar95 = vpinsrb_avx(ZEXT416(auVar95._0_4_),(int)psVar58,4);
            auVar95 = vpslld_avx(auVar95,0x1f);
            auVar111 = vblendvps_avx(ZEXT816(0x3f80000000000000),auVar111,auVar95);
            uVar83 = vmovlps_avx(auVar111);
            psVar73->fdy = (float)(int)uVar83;
            psVar73->direction = (float)(int)((ulong)uVar83 >> 0x20);
            psVar73->sy = fVar112;
            psVar73->ey = fVar114;
            psVar73->next = (stbtt__active_edge *)0x0;
            if (fVar114 < fVar82 && (bVar79 && bVar25)) {
              psVar73->ey = fVar82;
              fVar114 = fVar82;
            }
            if (fVar114 < fVar82) {
              __assert_fail("z->ey >= scan_y_top",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                            ,0xc76,
                            "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                           );
            }
            psVar73->next = (stbtt__active_edge *)auStack_4c8._0_8_;
            auStack_4c8._0_8_ = psVar73;
          }
          psVar73 = psVar49;
        }
        if ((stbtt__active_edge *)auStack_4c8._0_8_ != (stbtt__active_edge *)0x0) {
          psStack_2d0 = psVar47;
          for (psVar58 = (stbtt__active_edge *)auStack_4c8._0_8_; psVar47 = psStack_2d0,
              psVar58 != (stbtt__active_edge *)0x0; psVar58 = psVar58->next) {
            fVar112 = psVar58->ey;
            if (fVar112 < fVar82) {
              __assert_fail("e->ey >= y_top",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                            ,0xba5,
                            "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                           );
            }
            fVar114 = psVar58->fx;
            auVar103 = ZEXT464((uint)fVar114);
            fVar110 = psVar58->fdx;
            auVar111 = ZEXT416((uint)fVar114);
            if ((fVar110 != 0.0) || (NAN(fVar110))) {
              fVar94 = psVar58->sy;
              if (fVar80 < fVar94) {
                __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                              ,3000,
                              "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                             );
              }
              fVar93 = fVar110 + fVar114;
              auVar113 = ZEXT464((uint)fVar93);
              auVar95 = vcmpss_avx(ZEXT416((uint)fVar82),ZEXT416((uint)fVar94),1);
              auVar95 = vblendvps_avx(auVar111,ZEXT416((uint)(fVar110 * (fVar94 - fVar82) + fVar114)
                                                      ),auVar95);
              fVar104 = auVar95._0_4_;
              if (0.0 <= fVar104) {
                auVar95 = vcmpss_avx(ZEXT416((uint)fVar112),ZEXT416((uint)fVar80),1);
                auVar95 = vblendvps_avx(ZEXT416((uint)fVar93),
                                        ZEXT416((uint)(fVar110 * (fVar112 - fVar82) + fVar114)),
                                        auVar95);
                fVar98 = auVar95._0_4_;
                if (((0.0 <= fVar98) && (fVar104 < (float)auStack_338._0_4_)) &&
                   (fVar98 < (float)auStack_338._0_4_)) {
                  auVar111 = vmaxss_avx(ZEXT416((uint)fVar94),ZEXT416((uint)fVar82));
                  uVar34 = (uint)fVar104;
                  auVar95 = vminss_avx(ZEXT416((uint)fVar112),ZEXT416((uint)fVar80));
                  uVar74 = (uint)fVar98;
                  fVar110 = auVar111._0_4_;
                  fVar112 = auVar95._0_4_;
                  if (uVar34 == uVar74) {
                    if (((int)uVar34 < 0) || (iStack_448 < (int)uVar34)) {
                      __assert_fail("x >= 0 && x < len",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                                    ,0xbd4,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    uVar75 = (ulong)uVar34;
                    *(float *)((long)&scanline->data + uVar75 * 4) =
                         (((fVar104 - (float)(int)uVar34) + (fVar98 - (float)(int)uVar34)) * -0.5 +
                         1.0) * psVar58->direction * (fVar112 - fVar110) +
                         *(float *)((long)&scanline->data + uVar75 * 4);
                    fVar114 = (fVar112 - fVar110) * psVar58->direction;
                  }
                  else {
                    fVar94 = psVar58->fdy;
                    uVar35 = uVar34;
                    fVar107 = fVar98;
                    if (fVar98 < fVar104) {
                      fVar114 = fVar82 - fVar112;
                      fVar112 = fVar80 + (fVar82 - fVar110);
                      fVar110 = fVar80 + fVar114;
                      fVar94 = (float)((uint)fVar94 ^ uStack_348);
                      uVar35 = uVar74;
                      uVar74 = uVar34;
                      fVar114 = fVar93;
                      fVar107 = fVar104;
                      fVar104 = fVar98;
                    }
                    iVar32 = uVar35 + 1;
                    fVar93 = ((float)iVar32 - fVar114) * fVar94 + fVar82;
                    fVar114 = psVar58->direction;
                    fVar98 = fVar114 * (fVar93 - fVar110);
                    *(float *)((long)&scanline->data + (long)(int)uVar35 * 4) =
                         fVar98 * (1.0 - ((fVar104 - (float)(int)uVar35) + 1.0) * 0.5) +
                         *(float *)((long)&scanline->data + (long)(int)uVar35 * 4);
                    uVar75 = (ulong)(int)uVar74;
                    for (lVar76 = (long)iVar32; lVar76 < (long)uVar75; lVar76 = lVar76 + 1) {
                      *(float *)((long)&scanline->data + lVar76 * 4) =
                           fVar94 * fVar114 * 0.5 + fVar98 +
                           *(float *)((long)&scanline->data + lVar76 * 4);
                      fVar98 = fVar94 * fVar114 + fVar98;
                    }
                    auVar102._8_4_ = 0x7fffffff;
                    auVar102._0_8_ = 0x7fffffff7fffffff;
                    auVar102._12_4_ = 0x7fffffff;
                    auVar111 = vandps_avx(ZEXT416((uint)fVar98),auVar102);
                    if (1.01 < auVar111._0_4_) {
                      __assert_fail("fabsf(area) <= 1.01f",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                                    ,0xbfb,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    *(float *)((long)&scanline->data + uVar75 * 4) =
                         fVar114 * (((fVar107 - (float)(int)uVar74) + 0.0) * -0.5 + 1.0) *
                         (fVar112 - ((float)(int)(uVar74 - iVar32) * fVar94 + fVar93)) + fVar98 +
                         *(float *)((long)&scanline->data + uVar75 * 4);
                    fVar114 = fVar114 * (fVar112 - fVar110);
                  }
                  pfStack_458[uVar75 + 1] = fVar114 + pfStack_458[uVar75 + 1];
                  goto LAB_0017dcc7;
                }
              }
              auStack_328 = auVar111;
              auStack_468 = ZEXT416((uint)fVar93);
              fStack_394 = fVar110;
              iVar32 = 0;
              while (iStack_390 != iVar32) {
                fVar94 = (float)iVar32;
                fVar93 = (float)(iVar32 + 1);
                fVar110 = auVar103._0_4_;
                fVar112 = (fVar94 - fVar110) / fStack_394 + fVar82;
                fVar114 = (fVar93 - fVar110) / fStack_394 + fVar82;
                auStack_4d8._0_4_ = fVar94;
                fVar104 = auVar113._0_4_;
                if ((fVar94 <= fVar110) || (fVar104 <= fVar93)) {
                  if ((fVar94 <= fVar104) || (fVar110 <= fVar93)) {
                    fVar98 = fVar82;
                    if (((fVar94 <= fVar110) || (fVar104 <= fVar94)) &&
                       ((fVar94 <= fVar104 || (fVar110 <= fVar94)))) {
                      if (((fVar110 < fVar93) && (fVar93 < fVar104)) ||
                         ((fVar104 < fVar93 && (fVar93 < fVar110)))) {
                        auStack_498._0_4_ = fVar114;
                        fVar112 = fVar82;
                        goto LAB_0017d9c2;
                      }
                      fVar112 = fVar82;
                      auVar111 = auVar113._0_16_;
                      goto LAB_0017da89;
                    }
                  }
                  else {
                    auStack_498._0_4_ = fVar114;
                    stbtt__handle_clipped_edge
                              ((float *)scanline,iVar32,psVar58,fVar110,fVar82,fVar93,fVar114);
                    fVar98 = (float)auStack_498._0_4_;
                    fVar110 = fVar93;
                    fVar94 = (float)auStack_4d8._0_4_;
                  }
                  stbtt__handle_clipped_edge
                            ((float *)scanline,iVar32,psVar58,fVar110,fVar98,fVar94,fVar112);
                  auVar111 = auStack_468;
                  fVar110 = (float)auStack_4d8._0_4_;
                }
                else {
                  auStack_498._0_4_ = fVar114;
                  stbtt__handle_clipped_edge
                            ((float *)scanline,iVar32,psVar58,fVar110,fVar82,fVar94,fVar112);
                  fVar110 = (float)auStack_4d8._0_4_;
                  fVar114 = (float)auStack_498._0_4_;
LAB_0017d9c2:
                  stbtt__handle_clipped_edge
                            ((float *)scanline,iVar32,psVar58,fVar110,fVar112,fVar93,fVar114);
                  fVar112 = (float)auStack_498._0_4_;
                  auVar111 = auStack_468;
                  fVar110 = fVar93;
                }
LAB_0017da89:
                stbtt__handle_clipped_edge
                          ((float *)scanline,iVar32,psVar58,fVar110,fVar112,auVar111._0_4_,fVar80);
                auVar103 = ZEXT1664(auStack_328);
                auVar113 = ZEXT1664(auStack_468);
                iVar32 = iVar32 + 1;
              }
            }
            else if (fVar114 < (float)auStack_338._0_4_) {
              if (0.0 <= fVar114) {
                auStack_328 = auVar111;
                stbtt__handle_clipped_edge
                          ((float *)scanline,(int)fVar114,psVar58,fVar114,fVar82,fVar114,fVar80);
                iVar32 = (int)fVar114 + 1;
                auVar111 = auStack_328;
              }
              else {
                iVar32 = 0;
              }
              stbtt__handle_clipped_edge
                        (pfStack_458,iVar32,psVar58,auVar111._0_4_,fVar82,auVar111._0_4_,fVar80);
            }
LAB_0017dcc7:
          }
        }
        fVar80 = 0.0;
        lVar76 = lStack_2f8;
        psVar56 = scanline;
        uVar75 = uStack_3c8;
        while (bVar25 = lVar76 != 0, lVar76 = lVar76 + -1, bVar25) {
          fVar80 = fVar80 + *(float *)((long)&psVar56->data + lStack_2c8 * 4);
          auVar96._8_4_ = 0x7fffffff;
          auVar96._0_8_ = 0x7fffffff7fffffff;
          auVar96._12_4_ = 0x7fffffff;
          auVar111 = vandps_avx(ZEXT416((uint)(fVar80 + *(float *)&psVar56->data)),auVar96);
          iVar32 = (int)(auVar111._0_4_ * 255.0 + 0.5);
          if (0xfe < iVar32) {
            iVar32 = 0xff;
          }
          puStack_3b8[(int)uVar75] = (uchar)iVar32;
          uVar75 = (ulong)((int)uVar75 + 1);
          psVar56 = (stbtt__buf *)((long)&psVar56->data + 4);
        }
        plVar50 = (long *)auStack_4c8;
        while (plVar50 = (long *)*plVar50, plVar50 != (long *)0x0) {
          *(float *)(plVar50 + 1) = *(float *)((long)plVar50 + 0xc) + *(float *)(plVar50 + 1);
        }
        uVar75 = (ulong)(iStack_39c + 1);
        uStack_3c8 = (ulong)(uint)((int)uStack_3c8 + auStack_4c8._12_4_);
        iVar32 = iStack_444 + 1;
      }
      while (puVar48 != (undefined8 *)0x0) {
        puVar16 = (undefined8 *)*puVar48;
        ImGui::MemFree(puVar48);
        puVar48 = puVar16;
      }
      if (scanline != asStack_238) {
        ImGui::MemFree(scanline);
      }
      ImGui::MemFree(psStack_478);
    }
    ImGui::MemFree(pvStack_4a0);
    ImGui::MemFree(psStack_3e0);
  }
LAB_0017dded:
  ImGui::MemFree((void *)CONCAT44(uStack_470._4_4_,(stbtt_uint32)uStack_470));
  uVar34._0_2_ = psStack_408->x;
  uVar34._2_2_ = psStack_408->y;
  uVar35._0_2_ = psStack_408->w;
  uVar35._2_2_ = psStack_408->h;
  if (1 < (byte)uStack_350) {
    uVar36 = vpextrw_avx(ZEXT416(uVar34),0);
    lVar76 = CONCAT44((int)((ulong)psStack_408 >> 0x20),uVar36);
    iVar61 = vpextrw_avx(ZEXT416(uVar34),1);
    puVar45 = puStack_3d8 + iVar61 * auStack_4c8._12_4_ + lVar76;
    iVar33 = vpextrw_avx(ZEXT416(uVar35),1);
    psVar73 = (stbtt__active_edge *)(ulong)(uVar35 & 0xffff);
    iVar32 = (uVar35 & 0xffff) - uVar62;
    asStack_238[0].data._0_4_ = 0;
    asStack_238[0].data._4_4_ = 0;
    if (iVar32 < 0) {
      iVar32 = -1;
    }
    psVar58 = (stbtt__active_edge *)((long)iVar32 + 1);
    puVar69 = puStack_300 + iVar61 * auStack_4c8._12_4_ + lVar76 + (long)iVar32;
    iVar32 = 0;
    while (uVar75 = uStack_350, iVar32 != iVar33) {
      auStack_4d8._0_4_ = iVar32;
      memset(asStack_238,0,uStack_350);
      puVar64 = puVar69;
      psVar49 = psVar58;
      switch((int)uVar75) {
      case 2:
        uVar75 = 0;
        for (psVar51 = (stbtt__active_edge *)0x0; psVar58 != psVar51;
            psVar51 = (stbtt__active_edge *)((long)&psVar51->next + 1)) {
          bVar11 = puVar45[(long)psVar51];
          bVar12 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)psVar51 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)psVar51 + 2 & 7)) = bVar11;
          uVar74 = (int)uVar75 + ((uint)bVar11 - (uint)bVar12);
          uVar75 = (ulong)uVar74;
          puVar45[(long)psVar51] = (uchar)(uVar74 >> 1);
        }
        break;
      case 3:
        uVar75 = 0;
        for (psVar51 = (stbtt__active_edge *)0x0; psVar58 != psVar51;
            psVar51 = (stbtt__active_edge *)((long)&psVar51->next + 1)) {
          bVar11 = puVar45[(long)psVar51];
          bVar12 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)psVar51 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)psVar51 + 3 & 7)) = bVar11;
          uVar75 = (ulong)((int)uVar75 + ((uint)bVar11 - (uint)bVar12));
          puVar45[(long)psVar51] = (uchar)(uVar75 / 3);
        }
        break;
      case 4:
        uVar75 = 0;
        for (psVar51 = (stbtt__active_edge *)0x0; psVar58 != psVar51;
            psVar51 = (stbtt__active_edge *)((long)&psVar51->next + 1)) {
          bVar11 = puVar45[(long)psVar51];
          uVar66 = (ulong)((uint)psVar51 & 7);
          bVar12 = *(byte *)((long)&asStack_238[0].data + uVar66);
          *(byte *)((long)&asStack_238[0].data + (uVar66 ^ 4)) = bVar11;
          uVar74 = (int)uVar75 + ((uint)bVar11 - (uint)bVar12);
          uVar75 = (ulong)uVar74;
          puVar45[(long)psVar51] = (uchar)(uVar74 >> 2);
        }
        break;
      case 5:
        uVar75 = 0;
        for (psVar51 = (stbtt__active_edge *)0x0; psVar58 != psVar51;
            psVar51 = (stbtt__active_edge *)((long)&psVar51->next + 1)) {
          bVar11 = puVar45[(long)psVar51];
          bVar12 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)psVar51 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)psVar51 + 5 & 7)) = bVar11;
          uVar75 = (ulong)((int)uVar75 + ((uint)bVar11 - (uint)bVar12));
          puVar45[(long)psVar51] = (uchar)(uVar75 / 5);
        }
        break;
      default:
        uVar75 = 0;
        for (psVar51 = (stbtt__active_edge *)0x0; psVar58 != psVar51;
            psVar51 = (stbtt__active_edge *)((long)&psVar51->next + 1)) {
          bVar11 = puVar45[(long)psVar51];
          bVar12 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)psVar51 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)(uVar62 + (uint)psVar51 & 7)) = bVar11;
          uVar74 = (int)uVar75 + ((uint)bVar11 - (uint)bVar12);
          uVar75 = (ulong)uVar74;
          puVar45[(long)psVar51] = (uchar)(uVar74 / uVar62);
        }
      }
      for (; psVar49 < psVar73; psVar49 = (stbtt__active_edge *)((long)&psVar49->next + 1)) {
        if (*puVar64 != '\0') {
          __assert_fail("pixels[i] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                        ,0xf41,
                        "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)");
        }
        uVar74 = (int)uVar75 -
                 (uint)*(byte *)((long)&asStack_238[0].data + (ulong)((uint)psVar49 & 7));
        uVar75 = (ulong)uVar74;
        *puVar64 = (uchar)(uVar74 / uVar62);
        puVar64 = puVar64 + 1;
      }
      puVar45 = puVar45 + lVar40;
      puVar69 = puVar69 + lVar40;
      iVar32 = auStack_4d8._0_4_ + 1;
    }
    uVar34._0_2_ = psStack_408->x;
    uVar34._2_2_ = psStack_408->y;
    uVar35._0_2_ = psStack_408->w;
    uVar35._2_2_ = psStack_408->h;
  }
  if (1 < (byte)uStack_3c0) {
    uVar36 = vpextrw_avx(ZEXT416(uVar34),0);
    lVar76 = CONCAT44((int)((ulong)psStack_408 >> 0x20),uVar36);
    iVar32 = vpextrw_avx(ZEXT416(uVar34),1);
    lVar78 = (long)(iVar32 * (int)lVar40);
    pbVar77 = puStack_3d8 + lVar78 + lVar76;
    uVar36 = vpextrw_avx(ZEXT416(uVar35),0);
    auStack_4d8._0_4_ = uVar36;
    iVar61 = vpextrw_avx(ZEXT416(uVar35),1);
    asStack_238[0].data._0_4_ = 0;
    asStack_238[0].data._4_4_ = 0;
    iVar32 = iVar61 - (int)uStack_3c0;
    if (iVar32 < 0) {
      iVar32 = -1;
    }
    uVar75 = (long)iVar32 + 1;
    puVar45 = puStack_3d8 + lVar40 * uVar75 + lVar78 + lVar76;
    for (iVar32 = 0; iVar32 != auStack_4d8._0_4_; iVar32 = iVar32 + 1) {
      memset(asStack_238,0,uStack_3c0);
      puVar69 = puVar45;
      uVar66 = uVar75;
      switch((int)uStack_3c0) {
      case 2:
        uVar54 = 0;
        pbVar68 = pbVar77;
        for (uVar65 = 0; uVar75 != uVar65; uVar65 = uVar65 + 1) {
          bVar11 = *pbVar68;
          bVar12 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar65 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar65 + 2 & 7)) = bVar11;
          uVar74 = (int)uVar54 + ((uint)bVar11 - (uint)bVar12);
          uVar54 = (ulong)uVar74;
          *pbVar68 = (byte)(uVar74 >> 1);
          pbVar68 = pbVar68 + lVar40;
        }
        break;
      case 3:
        uVar54 = 0;
        pbVar68 = pbVar77;
        for (uVar65 = 0; uVar75 != uVar65; uVar65 = uVar65 + 1) {
          bVar11 = *pbVar68;
          bVar12 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar65 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar65 + 3 & 7)) = bVar11;
          uVar54 = (ulong)((int)uVar54 + ((uint)bVar11 - (uint)bVar12));
          *pbVar68 = (byte)(uVar54 / 3);
          pbVar68 = pbVar68 + lVar40;
        }
        break;
      case 4:
        uVar54 = 0;
        pbVar68 = pbVar77;
        for (uVar65 = 0; uVar75 != uVar65; uVar65 = uVar65 + 1) {
          bVar11 = *pbVar68;
          uVar67 = (ulong)((uint)uVar65 & 7);
          bVar12 = *(byte *)((long)&asStack_238[0].data + uVar67);
          *(byte *)((long)&asStack_238[0].data + (uVar67 ^ 4)) = bVar11;
          uVar74 = (int)uVar54 + ((uint)bVar11 - (uint)bVar12);
          uVar54 = (ulong)uVar74;
          *pbVar68 = (byte)(uVar74 >> 2);
          pbVar68 = pbVar68 + lVar40;
        }
        break;
      case 5:
        uVar54 = 0;
        pbVar68 = pbVar77;
        for (uVar65 = 0; uVar75 != uVar65; uVar65 = uVar65 + 1) {
          bVar11 = *pbVar68;
          bVar12 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar65 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar65 + 5 & 7)) = bVar11;
          uVar54 = (ulong)((int)uVar54 + ((uint)bVar11 - (uint)bVar12));
          *pbVar68 = (byte)(uVar54 / 5);
          pbVar68 = pbVar68 + lVar40;
        }
        break;
      default:
        uVar54 = 0;
        pbVar68 = pbVar77;
        for (uVar65 = 0; uVar75 != uVar65; uVar65 = uVar65 + 1) {
          bVar11 = *pbVar68;
          bVar12 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar65 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)((int)uStack_3c0 + (uint)uVar65 & 7)) =
               bVar11;
          uVar54 = (ulong)((int)uVar54 + ((uint)bVar11 - (uint)bVar12));
          *pbVar68 = (byte)(uVar54 / (uStack_3c0 & 0xffffffff));
          pbVar68 = pbVar68 + lVar40;
        }
      }
      for (; uVar66 < CONCAT44((int)((ulong)psVar73 >> 0x20),iVar61); uVar66 = uVar66 + 1) {
        if (*puVar69 != '\0') {
          __assert_fail("pixels[i*stride_in_bytes] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                        ,0xf7f,
                        "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)");
        }
        uVar54 = (ulong)((int)uVar54 -
                        (uint)*(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar66 & 7)));
        *puVar69 = (uchar)(uVar54 / (uStack_3c0 & 0xffffffff));
        puVar69 = puVar69 + lVar40;
      }
      pbVar77 = pbVar77 + 1;
      puVar45 = puVar45 + 1;
    }
    uVar34._0_2_ = psStack_408->x;
    uVar34._2_2_ = psStack_408->y;
    uVar35._0_2_ = psStack_408->w;
    uVar35._2_2_ = psStack_408->h;
  }
  psStack_2d8->x0 = (short)uVar34;
  psStack_2d8->y0 = (short)(uVar34 >> 0x10);
  auVar111 = vpaddw_avx(ZEXT416(uVar34),ZEXT416(uVar35));
  psStack_2d8->x1 = (short)auVar111._0_4_;
  psStack_2d8->y1 = (short)((uint)auVar111._0_4_ >> 0x10);
  psStack_2d8->xadvance =
       (float)(int)(short)((short)(uStack_3a0 << 8) + (short)uStack_3a4) * fStack_3a8;
  auVar95 = vpinsrd_avx(ZEXT416(uStack_388),iStack_38c,1);
  auVar111 = vcvtdq2ps_avx(auVar95);
  auVar103 = ZEXT1664(auStack_258);
  auVar97._0_4_ = auVar111._0_4_ * auStack_258._0_4_ + auStack_268._0_4_;
  auVar97._4_4_ = auVar111._4_4_ * auStack_258._4_4_ + auStack_268._4_4_;
  auVar97._8_4_ = auVar111._8_4_ * auStack_258._8_4_ + auStack_268._8_4_;
  auVar97._12_4_ = auVar111._12_4_ * auStack_258._12_4_ + auStack_268._12_4_;
  uVar83 = vmovlps_avx(auVar97);
  psStack_2d8->xoff = (float)(int)uVar83;
  psStack_2d8->yoff = (float)(int)((ulong)uVar83 >> 0x20);
  auVar111 = vpmovzxwd_avx(ZEXT416(uVar35));
  auVar111 = vpaddd_avx(auVar95,auVar111);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar88._0_4_ = auVar111._0_4_ * auStack_258._0_4_ + auStack_268._0_4_;
  auVar88._4_4_ = auVar111._4_4_ * auStack_258._4_4_ + auStack_268._4_4_;
  auVar88._8_4_ = auVar111._8_4_ * auStack_258._8_4_ + auStack_268._8_4_;
  auVar88._12_4_ = auVar111._12_4_ * auStack_258._12_4_ + auStack_268._12_4_;
  uVar83 = vmovlps_avx(auVar88);
  psStack_2d8->xoff2 = (float)(int)uVar83;
  psStack_2d8->yoff2 = (float)(int)((ulong)uVar83 >> 0x20);
  lVar78 = lStack_360;
  lVar76 = lStack_358;
  pIVar37 = pIStack_3d0;
  psVar42 = psStack_370;
LAB_0017e388:
  lVar76 = lVar76 + 1;
  lVar78 = lVar78 + 1;
  goto LAB_0017cd47;
}

Assistant:

bool    ImFontAtlas::Build()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");

    // Select builder
    // - Note that we do not reassign to atlas->FontBuilderIO, since it is likely to point to static data which
    //   may mess with some hot-reloading schemes. If you need to assign to this (for dynamic selection) AND are
    //   using a hot-reloading scheme that messes up static data, store your own instance of ImFontBuilderIO somewhere
    //   and point to it instead of pointing directly to return value of the GetBuilderXXX functions.
    const ImFontBuilderIO* builder_io = FontBuilderIO;
    if (builder_io == NULL)
    {
#ifdef IMGUI_ENABLE_FREETYPE
        builder_io = ImGuiFreeType::GetBuilderForFreeType();
#elif defined(IMGUI_ENABLE_STB_TRUETYPE)
        builder_io = ImFontAtlasGetBuilderForStbTruetype();
#else
        IM_ASSERT(0); // Invalid Build function
#endif
    }

    // Build
    return builder_io->FontBuilder_Build(this);
}